

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_greedy_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *ilimit_w;
  int *iEnd;
  undefined8 *puVar1;
  uint uVar2;
  BYTE *pBVar3;
  ZSTD_matchState_t *pZVar4;
  int *piVar5;
  BYTE *pBVar6;
  undefined8 uVar7;
  uint uVar8;
  int *piVar9;
  size_t sVar10;
  BYTE *iStart;
  ulong uVar11;
  int *mEnd;
  int *piVar12;
  uint uVar13;
  int *ip;
  BYTE *pBVar14;
  long lVar15;
  BYTE *pBVar16;
  U32 UVar17;
  seqDef *psVar18;
  uint local_a0;
  uint local_9c;
  int local_88;
  size_t offsetFound;
  BYTE *local_40;
  uint *local_38;
  
  pBVar3 = (ms->window).base;
  uVar2 = (ms->window).dictLimit;
  iStart = pBVar3 + uVar2;
  local_9c = *rep;
  pZVar4 = ms->dictMatchState;
  piVar5 = (int *)(pZVar4->window).nextSrc;
  pBVar6 = (pZVar4->window).base;
  local_40 = pBVar6 + (pZVar4->window).dictLimit;
  uVar8 = ((int)src - ((int)iStart + (int)local_40)) + (int)piVar5;
  if (uVar8 < local_9c) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x417a,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_a0 = rep[1];
  local_38 = rep;
  if (uVar8 < local_a0) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x417b,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  iEnd = (int *)((long)src + srcSize);
  uVar13 = ((int)pBVar6 - (int)piVar5) + uVar2;
  ip = (int *)((long)src + (ulong)(uVar8 == 0));
  piVar9 = (int *)((long)src + (srcSize - 8));
  ilimit_w = iEnd + -8;
LAB_00130879:
  do {
    if (piVar9 <= ip) {
      *local_38 = local_9c;
      local_38[1] = local_a0;
      return (long)iEnd - (long)src;
    }
    local_88 = (int)pBVar3;
    uVar8 = (((int)ip - local_88) - local_9c) + 1;
    if (uVar8 - uVar2 < 0xfffffffd) {
      piVar12 = (int *)(pBVar3 + uVar8);
      if (uVar8 < uVar2) {
        piVar12 = (int *)(pBVar6 + (uVar8 - uVar13));
      }
      if (*piVar12 != *(int *)((long)ip + 1)) goto LAB_001308bc;
      mEnd = iEnd;
      if (uVar8 < uVar2) {
        mEnd = piVar5;
      }
      sVar10 = ZSTD_count_2segments
                         ((BYTE *)((long)ip + 5),(BYTE *)(piVar12 + 1),(BYTE *)iEnd,(BYTE *)mEnd,
                          iStart);
      sVar10 = sVar10 + 4;
      ip = (int *)((long)ip + 1);
LAB_001309a3:
      UVar17 = 1;
    }
    else {
LAB_001308bc:
      offsetFound = 999999999;
      sVar10 = ZSTD_HcFindBestMatch_dictMatchState_selectMLS
                         (ms,(BYTE *)ip,(BYTE *)iEnd,&offsetFound);
      if (sVar10 < 4) {
        ip = (int *)((long)ip + ((long)ip - (long)src >> 8) + 1);
        goto LAB_00130879;
      }
      if (offsetFound == 0) goto LAB_001309a3;
      uVar11 = (long)ip + (-(long)pBVar3 - offsetFound) + -0xfffffffe;
      pBVar14 = pBVar3;
      pBVar16 = iStart;
      if ((uint)uVar11 < uVar2) {
        pBVar14 = pBVar6 + -(ulong)uVar13;
        pBVar16 = local_40;
      }
      pBVar14 = pBVar14 + (uVar11 & 0xffffffff);
      for (; ((src < ip && (pBVar16 < pBVar14)) && (*(BYTE *)((long)ip + -1) == pBVar14[-1]));
          ip = (int *)((long)ip + -1)) {
        pBVar14 = pBVar14 + -1;
        sVar10 = sVar10 + 1;
      }
      local_a0 = local_9c;
      local_9c = (int)offsetFound - 2;
      UVar17 = (int)offsetFound + 1;
    }
    if (seqStore->maxNbSeq <=
        (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_00130c98:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2038,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < seqStore->maxNbLit) {
LAB_00130cf5:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203a,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar11 = (long)ip - (long)src;
    pBVar16 = seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < pBVar16 + uVar11) {
LAB_00130cb7:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203b,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (iEnd < ip) {
LAB_00130cd6:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203c,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (ilimit_w < ip) {
      ZSTD_safecopyLiterals(pBVar16,(BYTE *)src,(BYTE *)ip,(BYTE *)ilimit_w);
LAB_00130a18:
      seqStore->lit = seqStore->lit + uVar11;
      if (0xffff < uVar11) {
        if (seqStore->longLengthID != 0) {
          __assert_fail("seqStorePtr->longLengthID == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x204d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthID = 1;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
    }
    else {
      uVar7 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar16 = *src;
      *(undefined8 *)(pBVar16 + 8) = uVar7;
      pBVar16 = seqStore->lit;
      if (0x10 < uVar11) {
        lVar15 = (long)(pBVar16 + 0x10) - ((long)src + 0x10);
        if (lVar15 < 8) {
          if (-0x10 < lVar15) {
            __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x1268,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
        }
        else if (0xffffffffffffffe0 < lVar15 - 0x10U) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x1270,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar7 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar16 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar16 + 0x18) = uVar7;
        if (0x20 < (long)uVar11) {
          lVar15 = 0;
          do {
            puVar1 = (undefined8 *)((long)src + lVar15 + 0x20);
            uVar7 = puVar1[1];
            pBVar14 = pBVar16 + lVar15 + 0x20;
            *(undefined8 *)pBVar14 = *puVar1;
            *(undefined8 *)(pBVar14 + 8) = uVar7;
            puVar1 = (undefined8 *)((long)src + lVar15 + 0x30);
            uVar7 = puVar1[1];
            *(undefined8 *)(pBVar14 + 0x10) = *puVar1;
            *(undefined8 *)(pBVar14 + 0x18) = uVar7;
            lVar15 = lVar15 + 0x20;
          } while (pBVar14 + 0x20 < pBVar16 + uVar11);
        }
        goto LAB_00130a18;
      }
      seqStore->lit = pBVar16 + uVar11;
    }
    psVar18 = seqStore->sequences;
    psVar18->litLength = (U16)uVar11;
    psVar18->offset = UVar17;
    if (0xffff < sVar10 - 3) {
      if (seqStore->longLengthID != 0) {
LAB_00130d14:
        __assert_fail("seqStorePtr->longLengthID == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2058,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      seqStore->longLengthID = 2;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar18->matchLength = (U16)(sVar10 - 3);
    psVar18 = psVar18 + 1;
    seqStore->sequences = psVar18;
    uVar8 = local_a0;
    for (ip = (int *)((long)ip + sVar10); local_a0 = uVar8, src = ip, ip <= piVar9;
        ip = (int *)((long)ip + sVar10 + 4)) {
      uVar8 = ((int)ip - local_88) - local_a0;
      pBVar16 = pBVar3;
      if (uVar8 < uVar2) {
        pBVar16 = pBVar6 + -(ulong)uVar13;
      }
      if ((0xfffffffc < uVar8 - uVar2) || (*(int *)(pBVar16 + uVar8) != *ip)) break;
      piVar12 = iEnd;
      if (uVar8 < uVar2) {
        piVar12 = piVar5;
      }
      sVar10 = ZSTD_count_2segments
                         ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar16 + uVar8) + 4),(BYTE *)iEnd,
                          (BYTE *)piVar12,iStart);
      if (seqStore->maxNbSeq <= (ulong)((long)psVar18 - (long)seqStore->sequencesStart >> 3))
      goto LAB_00130c98;
      if (0x20000 < seqStore->maxNbLit) goto LAB_00130cf5;
      pBVar16 = seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < pBVar16) goto LAB_00130cb7;
      if (iEnd < ip) goto LAB_00130cd6;
      if (ilimit_w < ip) {
        ZSTD_safecopyLiterals(pBVar16,(BYTE *)ip,(BYTE *)ip,(BYTE *)ilimit_w);
      }
      else {
        uVar7 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar16 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar16 + 8) = uVar7;
      }
      psVar18 = seqStore->sequences;
      psVar18->litLength = 0;
      psVar18->offset = 1;
      if (0xffff < sVar10 + 1) {
        if (seqStore->longLengthID != 0) goto LAB_00130d14;
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar18->matchLength = (U16)(sVar10 + 1);
      psVar18 = psVar18 + 1;
      seqStore->sequences = psVar18;
      uVar8 = local_9c;
      local_9c = local_a0;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_greedy_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 0, ZSTD_dictMatchState);
}